

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_memory.h
# Opt level: O0

void absl::lts_20250127::container_internal::
     map_slot_policy<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>::
     construct<std::allocator<std::pair<std::vector<int,std::allocator<int>>const,std::vector<int,std::allocator<int>>>>,std::piecewise_construct_t_const&,std::tuple<std::vector<int,std::allocator<int>>const&>,std::tuple<>>
               (allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>
                *alloc,slot_type *slot,piecewise_construct_t *args,
               tuple<const_std::vector<int,_std::allocator<int>_>_&> *args_1,tuple<> *args_2)

{
  tuple<> *args_local_2;
  tuple<const_std::vector<int,_std::allocator<int>_>_&> *args_local_1;
  piecewise_construct_t *args_local;
  slot_type *slot_local;
  allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>
  *alloc_local;
  
  map_slot_policy<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>::
  emplace(slot);
  std::
  allocator_traits<std::allocator<std::pair<std::vector<int,std::allocator<int>>const,std::vector<int,std::allocator<int>>>>>
  ::
  construct<std::pair<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>,std::piecewise_construct_t_const&,std::tuple<std::vector<int,std::allocator<int>>const&>,std::tuple<>>
            (alloc,(pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>
                    *)&slot->value,args,args_1,args_2);
  return;
}

Assistant:

static void construct(Allocator* alloc, slot_type* slot, Args&&... args) {
    emplace(slot);
    if (kMutableKeys::value) {
      absl::allocator_traits<Allocator>::construct(*alloc, &slot->mutable_value,
                                                   std::forward<Args>(args)...);
    } else {
      absl::allocator_traits<Allocator>::construct(*alloc, &slot->value,
                                                   std::forward<Args>(args)...);
    }
  }